

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<duckdb::list_entry_t,long,long,duckdb::BinaryLambdaWrapper,bool,duckdb::ListLengthBinaryFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,true,false>
               (Vector *param_1,undefined8 param_2,Vector *param_3,undefined8 param_4)

{
  bool bVar1;
  Vector *this;
  TemplatedValidityMask<unsigned_long> *other;
  long *count;
  ValidityMask *pVVar2;
  ValidityMask *result_validity;
  long *result_data;
  long *rdata;
  list_entry_t *ldata;
  ValidityMask *in_stack_ffffffffffffff98;
  VectorType vector_type_p;
  undefined1 is_null;
  
  is_null = (undefined1)((ulong)param_2 >> 0x38);
  this = (Vector *)FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x138a482);
  other = (TemplatedValidityMask<unsigned_long> *)FlatVector::GetData<long>((Vector *)0x138a491);
  bVar1 = ConstantVector::IsNull((Vector *)0x138a4a0);
  vector_type_p = (VectorType)((ulong)other >> 0x38);
  if (bVar1) {
    Vector::SetVectorType(this,vector_type_p);
    ConstantVector::SetNull(param_1,(bool)is_null);
  }
  else {
    Vector::SetVectorType(this,vector_type_p);
    count = FlatVector::GetData<long>((Vector *)0x138a4df);
    pVVar2 = FlatVector::Validity((Vector *)0x138a4ee);
    bVar1 = BinaryLambdaWrapper::AddsNulls();
    if (bVar1) {
      FlatVector::Validity((Vector *)0x138a512);
      TemplatedValidityMask<unsigned_long>::Copy
                ((TemplatedValidityMask<unsigned_long> *)this,other,(idx_t)count);
    }
    else {
      FlatVector::Validity((Vector *)0x138a53a);
      FlatVector::SetValidity(param_3,in_stack_ffffffffffffff98);
    }
    ExecuteFlatLoop<duckdb::list_entry_t,long,long,duckdb::BinaryLambdaWrapper,bool,duckdb::ListLengthBinaryFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,true,false>
              (this,other,count,param_4,pVVar2);
  }
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}